

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O3

bool tinyusdz::IsUSD(uint8_t *addr,size_t length,string *detected_format)

{
  bool bVar1;
  char *pcVar2;
  
  if (8 < length) {
    if (addr[8] == '0' && *(long *)addr == 0x2e31206164737523) {
      if (detected_format == (string *)0x0) {
        return true;
      }
      pcVar2 = "usda";
      goto LAB_0012ee5f;
    }
    if ((0x57 < length) && (*(long *)addr == 0x434453552d525850)) {
      if (detected_format == (string *)0x0) {
        return true;
      }
      pcVar2 = "usdc";
      goto LAB_0012ee5f;
    }
  }
  bVar1 = IsUSDZ(addr,length);
  if (!bVar1) {
    return false;
  }
  if (detected_format == (string *)0x0) {
    return true;
  }
  pcVar2 = "usdz";
LAB_0012ee5f:
  ::std::__cxx11::string::_M_replace
            ((ulong)detected_format,0,(char *)detected_format->_M_string_length,(ulong)pcVar2);
  return true;
}

Assistant:

bool IsUSD(const uint8_t *addr, const size_t length, std::string *detected_format) {
  if (IsUSDA(addr, length)) {
    if (detected_format) {
      (*detected_format) = "usda";
    }
    return true;
  }

  if (IsUSDC(addr, length)) {
    if (detected_format) {
      (*detected_format) = "usdc";
    }
    return true;
  }

  if (IsUSDZ(addr, length)) {
    if (detected_format) {
      (*detected_format) = "usdz";
    }
    return true;
  }

  return false;
}